

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O3

InputList * __thiscall Omega_h::InputMap::get_list(InputMap *this,string *name)

{
  bool bVar1;
  Input *input;
  InputList *pIVar2;
  shared_ptr<Omega_h::Input> sptr;
  shared_ptr<Omega_h::Input> local_20;
  
  bVar1 = is_input<Omega_h::InputList>(this,name);
  if (!bVar1) {
    local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0x30);
    (((InputList *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Input)._vptr_Input = (_func_int **)0x0;
    (((InputList *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Input).parent = (Input *)0x0;
    *(undefined8 *)
     &(((InputList *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_Input).used = 0;
    (((InputList *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    entries).
    super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (((InputList *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Input)._vptr_Input = (_func_int **)&PTR__InputList_004b9870;
    (((InputList *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    entries).
    super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (((InputList *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    entries).
    super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (((InputList *)local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    entries).
    super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Omega_h::InputList*>
              (&local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (InputList *)
               local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    add(this,name,&local_20);
    if (local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
  }
  input = find_named_input(this,name);
  input->used = true;
  pIVar2 = as_type<Omega_h::InputList>(input);
  return pIVar2;
}

Assistant:

InputList& InputMap::get_list(std::string const& name) {
  if (!is_list(name)) {
    std::shared_ptr<Input> sptr(new InputList());
    this->add(name, std::move(sptr));
  }
  return this->use_input<InputList>(name);
}